

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall t_markdown_generator::generate_program(t_markdown_generator *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *psVar6;
  ostream *poVar7;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar8;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *pvVar9;
  reference pptVar10;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *pvVar11;
  reference pptVar12;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *pvVar13;
  reference pptVar14;
  vector<t_service_*,_std::allocator<t_service_*>_> *pvVar15;
  reference pptVar16;
  int __oflag;
  string local_280 [32];
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_260
  ;
  t_service **local_258;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_250
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_220;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_1f0
  ;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_1c0;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  undefined1 local_188 [8];
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string fname;
  string local_e8;
  string local_c8 [8];
  string pname;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_markdown_generator *ptStack_10;
  int r;
  t_markdown_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_38);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar4,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar2;
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      pname.field_2._M_local_buf[10] = '\x01';
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_98);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,pcVar4,(allocator *)(pname.field_2._M_local_buf + 0xb));
      std::operator+(&local_58,&local_78,": ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      std::operator+(__return_storage_ptr__,&local_58,pcVar4);
      pname.field_2._M_local_buf[10] = '\0';
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  psVar6 = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
  std::__cxx11::string::string(local_c8,(string *)psVar6);
  std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8),local_c8);
  make_file_name(&local_e8,this,(string *)((long)&fname.field_2 + 8));
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_148);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 &local_148,&this->current_file_);
  std::__cxx11::string::~string((string *)&local_148);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,pcVar4,
             (allocator *)
             ((long)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_out_,(char *)local_168,__oflag);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  poVar7 = std::operator<<((ostream *)&this->f_out_,"# Thrift module: ");
  poVar7 = std::operator<<(poVar7,local_c8);
  poVar7 = std::operator<<(poVar7,'\n');
  std::operator<<(poVar7,'\n');
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  poVar7 = std::operator<<((ostream *)&this->f_out_,'\n');
  std::operator<<(poVar7,'\n');
  generate_program_toc(this);
  pvVar8 = t_program::get_consts((this->super_t_generator).program_);
  bVar1 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(pvVar8);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&this->f_out_,"***");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"## Constants");
    poVar7 = std::operator<<(poVar7,'\n');
    std::operator<<(poVar7,'\n');
    pvVar8 = t_program::get_consts((this->super_t_generator).program_);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_188,pvVar8);
    poVar7 = std::operator<<((ostream *)&this->f_out_,"|Constant|Type|Value||");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"|---|---|---|---|");
    std::operator<<(poVar7,'\n');
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)
               &enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<t_const_*,_std::allocator<t_const_*>_> *)local_188);
    (*(this->super_t_generator)._vptr_t_generator[0x11])
              (this,&enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)
               &enums.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::operator<<((ostream *)&this->f_out_,'\n');
    std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_188);
  }
  pvVar9 = t_program::get_enums((this->super_t_generator).program_);
  bVar1 = std::vector<t_enum_*,_std::allocator<t_enum_*>_>::empty(pvVar9);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&this->f_out_,"***");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"## Enumerations");
    poVar7 = std::operator<<(poVar7,'\n');
    std::operator<<(poVar7,'\n');
    pvVar9 = t_program::get_enums((this->super_t_generator).program_);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,pvVar9);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    __normal_iterator(&local_1c0);
    local_1c0._M_current =
         (t_enum **)
         std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                   ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    while( true ) {
      typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1c0,
                         (__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                          *)&typedefs.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
                 operator*(&local_1c0);
      (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar10);
      __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
      operator++(&local_1c0);
    }
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  }
  pvVar11 = t_program::get_typedefs((this->super_t_generator).program_);
  bVar1 = std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::empty(pvVar11);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&this->f_out_,"***");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"## Type declarations");
    poVar7 = std::operator<<(poVar7,'\n');
    std::operator<<(poVar7,'\n');
    pvVar11 = t_program::get_typedefs((this->super_t_generator).program_);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,pvVar11);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    __normal_iterator(&local_1f0);
    local_1f0._M_current =
         (t_typedef **)
         std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                   ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    while( true ) {
      objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1f0,
                         (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                          *)&objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar12 = __gnu_cxx::
                 __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                 ::operator*(&local_1f0);
      (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar12);
      __gnu_cxx::
      __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
      operator++(&local_1f0);
    }
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  }
  pvVar13 = t_program::get_objects((this->super_t_generator).program_);
  bVar1 = std::vector<t_struct_*,_std::allocator<t_struct_*>_>::empty(pvVar13);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&this->f_out_,"***");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"## Data structures");
    poVar7 = std::operator<<(poVar7,'\n');
    std::operator<<(poVar7,'\n');
    pvVar13 = t_program::get_objects((this->super_t_generator).program_);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,pvVar13);
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::__normal_iterator(&local_220);
    local_220._M_current =
         (t_struct **)
         std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                   ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    while( true ) {
      services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_220,
                         (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                          *)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pptVar14 = __gnu_cxx::
                 __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                 ::operator*(&local_220);
      uVar3 = (*((*pptVar14)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
      if ((uVar3 & 1) == 0) {
        pptVar14 = __gnu_cxx::
                   __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                   ::operator*(&local_220);
        (*(this->super_t_generator)._vptr_t_generator[0x15])(this,*pptVar14);
      }
      else {
        pptVar14 = __gnu_cxx::
                   __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                   ::operator*(&local_220);
        (*(this->super_t_generator)._vptr_t_generator[0x18])(this,*pptVar14);
      }
      __gnu_cxx::
      __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      operator++(&local_220);
    }
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  }
  pvVar15 = t_program::get_services((this->super_t_generator).program_);
  bVar1 = std::vector<t_service_*,_std::allocator<t_service_*>_>::empty(pvVar15);
  if (!bVar1) {
    poVar7 = std::operator<<((ostream *)&this->f_out_,"***");
    poVar7 = std::operator<<(poVar7,'\n');
    poVar7 = std::operator<<(poVar7,"## Services");
    poVar7 = std::operator<<(poVar7,'\n');
    std::operator<<(poVar7,'\n');
    pvVar15 = t_program::get_services((this->super_t_generator).program_);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,pvVar15);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    __normal_iterator(&local_250);
    local_258 = (t_service **)
                std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                          ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    local_250._M_current = local_258;
    while( true ) {
      local_260._M_current =
           (t_service **)
           std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                     ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
      bVar1 = __gnu_cxx::operator!=(&local_250,&local_260);
      if (!bVar1) break;
      pptVar16 = __gnu_cxx::
                 __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                 ::operator*(&local_250);
      (*(this->super_t_generator)._vptr_t_generator[0x1a])(local_280,this,*pptVar16);
      std::__cxx11::string::operator=((string *)&(this->super_t_generator).service_name_,local_280);
      std::__cxx11::string::~string(local_280);
      pptVar16 = __gnu_cxx::
                 __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                 ::operator*(&local_250);
      (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar16);
      __gnu_cxx::
      __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
      operator++(&local_250);
    }
    std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
              ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  }
  iVar2 = 10;
  std::operator<<((ostream *)&this->f_out_,'\n');
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_out_,iVar2);
  generate_index(this);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string(local_c8);
  return;
}

Assistant:

void t_markdown_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  string pname = program_->get_name();
  current_file_ = make_file_name(pname);
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "# Thrift module: " << pname << endl << endl;

  print_doc(program_);
  f_out_ << endl << endl;

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "***" << endl << "## Constants" << endl << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "|Constant|Type|Value||" << endl
           << "|---|---|---|---|" << endl;
    generate_consts(consts);
    f_out_ << endl;
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "***" << endl << "## Enumerations" << endl << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "***" << endl << "## Type declarations" << endl << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "***" << endl << "## Data structures" << endl << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "***" << endl << "## Services" << endl << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << endl;
  f_out_.close();

  generate_index();
}